

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void * parallel_iterator_thread(void *args)

{
  void *pvVar1;
  fdb_status fVar2;
  int iVar3;
  fdb_status fVar4;
  ulong uVar5;
  fdb_doc *pfVar6;
  pthread_mutex_t *__mutex;
  fdb_doc *doc;
  fdb_iterator *fit2;
  fdb_kvs_handle *snap_db;
  fdb_iterator *fit;
  fdb_kvs_handle *db;
  fdb_seqnum_t snap_seqnum;
  fdb_file_handle *dbfile;
  char key [16];
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_doc *local_b8;
  fdb_iterator *local_b0;
  fdb_kvs_handle *local_a8;
  fdb_iterator *local_a0;
  fdb_kvs_handle *local_98;
  ulong local_90;
  ulong local_88;
  fdb_file_handle *local_80;
  char local_78 [16];
  pthread_mutex_t *local_68;
  undefined8 *local_60;
  fdb_kvs_config local_58;
  timeval local_40;
  
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  fdb_get_default_kvs_config();
  __mutex = (pthread_mutex_t *)((long)args + 0x18);
  local_90 = 0;
  local_68 = __mutex;
  local_60 = (undefined8 *)args;
  while( true ) {
    if (*(int *)((long)args + 8) <= (int)local_90) {
      pthread_exit((void *)0x0);
    }
    fVar2 = fdb_open(&local_80,*(char **)((long)args + 0x10),*args);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe3d);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe3d,"void *parallel_iterator_thread(void *)");
    }
    fVar2 = fdb_kvs_open_default(local_80,&local_98,&local_58);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe3f);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe3f,"void *parallel_iterator_thread(void *)");
    }
    iVar3 = pthread_mutex_lock(__mutex);
    if (iVar3 != 0) break;
    fVar2 = fdb_snapshot_open(local_98,&local_a8,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119021;
    pthread_mutex_unlock(__mutex);
    fdb_get_kvs_seqnum(local_a8,&local_88);
    fVar2 = fdb_iterator_init(local_a8,&local_a0,(void *)0x0,0,(void *)0x0,0,0);
    fdb_iterator_sequence_init(local_a8,&local_b0,0,0,0);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) {
      uVar5 = 0;
      while (fVar2 == FDB_RESULT_SUCCESS) {
        local_b8 = (fdb_doc *)0x0;
        fVar2 = fdb_iterator_get(local_a0,&local_b8);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        sprintf(local_78,"key%05d",uVar5 & 0xffffffff);
        pfVar6 = local_b8;
        pvVar1 = local_b8->key;
        iVar3 = bcmp(pvVar1,local_78,local_b8->keylen);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_78,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xe57);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe57,"void *parallel_iterator_thread(void *)");
        }
        uVar5 = uVar5 + 1;
        if ((uVar5 != pfVar6->seqnum) &&
           (fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                   ), pfVar6 = local_b8, uVar5 != local_b8->seqnum)) {
          __assert_fail("doc->seqnum == (fdb_seqnum_t)i+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe58,"void *parallel_iterator_thread(void *)");
        }
        fdb_doc_free(pfVar6);
        local_b8 = (fdb_doc *)0x0;
        fVar2 = fdb_iterator_get(local_b0,&local_b8);
        pfVar6 = local_b8;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xe5e);
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe5e,"void *parallel_iterator_thread(void *)");
        }
        pvVar1 = local_b8->key;
        iVar3 = bcmp(pvVar1,local_78,local_b8->keylen);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_78,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xe5f);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe5f,"void *parallel_iterator_thread(void *)");
        }
        if ((uVar5 != pfVar6->seqnum) &&
           (fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                   ), pfVar6 = local_b8, uVar5 != local_b8->seqnum)) {
          __assert_fail("doc->seqnum == (fdb_seqnum_t)i+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe60,"void *parallel_iterator_thread(void *)");
        }
        fdb_doc_free(pfVar6);
        fVar2 = fdb_iterator_next(local_a0);
        fVar4 = fdb_iterator_next(local_b0);
        args = local_60;
        __mutex = local_68;
        if (fVar2 != fVar4) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                 );
          fVar4 = fdb_iterator_next(local_b0);
          args = local_60;
          __mutex = local_68;
          if (fVar2 != fVar4) {
            __assert_fail("status == fdb_iterator_next(fit2)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xe65,"void *parallel_iterator_thread(void *)");
          }
        }
      }
      local_90 = uVar5;
      if ((local_88 != (uVar5 & 0xffffffff)) &&
         (fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                 ), local_88 != (uVar5 & 0xffffffff))) {
        __assert_fail("(fdb_seqnum_t)i == snap_seqnum",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe67,"void *parallel_iterator_thread(void *)");
      }
      fVar2 = fdb_iterator_close(local_a0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe6b);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6b,"void *parallel_iterator_thread(void *)");
      }
      fVar2 = fdb_iterator_close(local_b0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe6d);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6d,"void *parallel_iterator_thread(void *)");
      }
      fVar2 = fdb_kvs_close(local_a8);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe6f);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6f,"void *parallel_iterator_thread(void *)");
      }
      fVar2 = fdb_kvs_close(local_98);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe71);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe71,"void *parallel_iterator_thread(void *)");
      }
      fVar2 = fdb_close(local_80);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe73);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe73,"void *parallel_iterator_thread(void *)");
      }
    }
  }
  std::__throw_system_error(iVar3);
LAB_00119021:
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xe44);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe44,"void *parallel_iterator_thread(void *)");
}

Assistant:

void *parallel_iterator_thread(void *args)
{
    TEST_INIT();

    struct piterator_ctx *ctx = (struct piterator_ctx *)args;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_iterator *fit, *fit2;
    fdb_status status;
    fdb_seqnum_t snap_seqnum;
    int num_read = 0;
    fdb_doc *doc;
    char key[16];

    while (num_read < ctx->num_docs) {
        status = fdb_open(&dbfile, ctx->filename, ctx->config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        ctx->lock.lock();
        // Open in-memory snapshot
        status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        ctx->lock.unlock();

        fdb_get_kvs_seqnum(snap_db, &snap_seqnum);
        // Iterate the in-memory snapshot
        status = fdb_iterator_init(snap_db, &fit, 0, 0, 0, 0, FDB_ITR_NONE);
        fdb_iterator_sequence_init(snap_db, &fit2, 0, 0, FDB_ITR_NONE);

        if (status == FDB_RESULT_ITERATOR_FAIL) {
            continue;
        }
        int i = 0;
        while (status == FDB_RESULT_SUCCESS) {
            doc = NULL;
            status = fdb_iterator_get(fit, &doc);
            if (status != FDB_RESULT_SUCCESS) {
                break;
            }
            sprintf(key, "key%05d", i);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CHK(doc->seqnum == (fdb_seqnum_t)i+1);
            // printf("Got %s seqnum %llu\n", key, doc->seqnum);
            fdb_doc_free(doc);
            doc = NULL;

            status = fdb_iterator_get(fit2, &doc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CHK(doc->seqnum == (fdb_seqnum_t)i+1);
            fdb_doc_free(doc);

            i++;
            status = fdb_iterator_next(fit);
            TEST_CHK(status == fdb_iterator_next(fit2));
        }
        TEST_CHK((fdb_seqnum_t)i == snap_seqnum);
        num_read = snap_seqnum;

        status = fdb_iterator_close(fit);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_iterator_close(fit2);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_close(snap_db);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_close(db);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // shutdown
    thread_exit(0);
    return NULL;
}